

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda.c
# Opt level: O1

void xc_lda_initalize(xc_func_type *func,size_t np,xc_lda_out_params *out)

{
  if (out->zk != (double *)0x0) {
    memset(out->zk,0,(long)(func->dim).zk * np * 8);
  }
  if (out->vrho != (double *)0x0) {
    memset(out->vrho,0,(long)(func->dim).vrho * np * 8);
  }
  if (out->v2rho2 != (double *)0x0) {
    memset(out->v2rho2,0,(long)(func->dim).v2rho2 * np * 8);
  }
  if (out->v3rho3 != (double *)0x0) {
    memset(out->v3rho3,0,(long)(func->dim).v3rho3 * np * 8);
  }
  if (out->v4rho4 != (double *)0x0) {
    memset(out->v4rho4,0,np * (long)(func->dim).v4rho4 * 8);
    return;
  }
  return;
}

Assistant:

void
xc_lda_initalize(const xc_func_type *func, size_t np, xc_lda_out_params *out)
{
  const xc_dimensions *dim = &(func->dim);

  /* initialize output */
  if(out->zk != NULL)
    libxc_memset(out->zk,     0, np*sizeof(double)*dim->zk);

  if(out->vrho != NULL)
    libxc_memset(out->vrho,   0, np*sizeof(double)*dim->vrho);

  if(out->v2rho2 != NULL)
    libxc_memset(out->v2rho2, 0, np*sizeof(double)*dim->v2rho2);

  if(out->v3rho3 != NULL)
    libxc_memset(out->v3rho3, 0, np*sizeof(double)*dim->v3rho3);

  if(out->v4rho4 != NULL)
    libxc_memset(out->v4rho4, 0, np*sizeof(double)*dim->v4rho4);
}